

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::crate::CrateReader::ReadIndices
          (CrateReader *this,
          vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_> *indices)

{
  StreamReader *this_00;
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  Index *__nbytes;
  void *__buf;
  string local_690;
  ostringstream local_670 [8];
  ostringstream ss_e_3;
  string local_4f8;
  ostringstream local_4d8 [8];
  ostringstream ss_e_2;
  string local_360;
  ostringstream local_340 [8];
  ostringstream ss_e_1;
  size_t datalen;
  ostringstream local_1a0 [8];
  ostringstream ss_e;
  ulong local_28;
  uint64_t n;
  vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_> *indices_local;
  CrateReader *this_local;
  
  n = (uint64_t)indices;
  indices_local = (vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_> *)this;
  bVar1 = StreamReader::read8(this->_sr,&local_28);
  if (bVar1) {
    if ((this->_config).maxNumIndices < local_28) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a0);
      poVar2 = ::std::operator<<((ostream *)local_1a0,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,"[Crate]");
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadIndices");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xda);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_1a0,"Too many indices.");
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)&datalen);
      ::std::__cxx11::string::~string((string *)&datalen);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
    }
    else if (local_28 == 0) {
      this_local._7_1_ = 1;
    }
    else {
      __buf = (void *)(local_28 * 4);
      pvVar3 = (void *)StreamReader::size(this->_sr);
      if (pvVar3 < __buf) {
        ::std::__cxx11::ostringstream::ostringstream(local_340);
        poVar2 = ::std::operator<<((ostream *)local_340,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[Crate]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReadIndices");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xe6);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_340,"Indices data exceeds USDC size.");
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_360);
        ::std::__cxx11::string::~string((string *)&local_360);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_340);
      }
      else {
        this->_memoryUsage = (long)__buf + this->_memoryUsage;
        if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
          ::std::__cxx11::ostringstream::ostringstream(local_4d8);
          poVar2 = ::std::operator<<((ostream *)local_4d8,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,"[Crate]");
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ReadIndices");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xe9);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)local_4d8,"Reached to max memory budget.");
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_4f8);
          ::std::__cxx11::string::~string((string *)&local_4f8);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_4d8);
        }
        else {
          ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::resize
                    ((vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_> *)n,
                     local_28);
          this_00 = this->_sr;
          __nbytes = ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                     ::data((vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                             *)n);
          pvVar3 = (void *)StreamReader::read(this_00,(int)__buf,__buf,(size_t)__nbytes);
          if (__buf == pvVar3) {
            this_local._7_1_ = 1;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_670);
            poVar2 = ::std::operator<<((ostream *)local_670,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,"[Crate]");
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ReadIndices");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xef);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)local_670,"Failed to read Indices array.");
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_690);
            ::std::__cxx11::string::~string((string *)&local_690);
            this_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_670);
          }
        }
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadIndices(std::vector<crate::Index> *indices) {
  uint64_t n;
  if (!_sr->read8(&n)) {
    return false;
  }

  if (n > _config.maxNumIndices) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many indices.");
  }

  if (n == 0) {
    return true;
  }

  DCOUT("ReadIndices: n = " << n);

  size_t datalen = size_t(n) * sizeof(crate::Index);

  if (datalen > _sr->size()) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Indices data exceeds USDC size.");
  }

  CHECK_MEMORY_USAGE(datalen);

  indices->resize(size_t(n));

  if (datalen != _sr->read(datalen, datalen,
                          reinterpret_cast<uint8_t *>(indices->data()))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read Indices array.");
  }

  return true;
}